

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall Tokenizer::resetLookaheadCheckMarks(Tokenizer *this)

{
  bool bVar1;
  pointer pTVar2;
  byte local_31;
  _Self local_20;
  _Self local_18;
  iterator it;
  Tokenizer *this_local;
  
  local_18._M_node = (this->position).it._M_node;
  it._M_node = (_List_node_base *)this;
  while( true ) {
    local_20._M_node =
         (_List_node_base *)std::__cxx11::list<Token,_std::allocator<Token>_>::end(&this->tokens);
    bVar1 = std::operator!=(&local_18,&local_20);
    local_31 = 0;
    if (bVar1) {
      pTVar2 = std::_List_iterator<Token>::operator->(&local_18);
      local_31 = pTVar2->checked;
    }
    if ((local_31 & 1) == 0) break;
    pTVar2 = std::_List_iterator<Token>::operator->(&local_18);
    pTVar2->checked = false;
    std::_List_iterator<Token>::operator++(&local_18,0);
  }
  return;
}

Assistant:

void Tokenizer::resetLookaheadCheckMarks()
{
	auto it = position.it;
	while (it != tokens.end() && it->checked)
	{
		it->checked = false;
		it++;
	}
}